

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* cxxopts::values::parser_tool::SplitSwitchDef
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *text)

{
  bool bVar1;
  char *__s;
  const_reference pvVar2;
  string_type local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string *long_sw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string *short_sw;
  undefined1 local_38 [8];
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  string *text_local;
  
  result._M_begin = (char *)text;
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_38);
  __s = (char *)std::__cxx11::string::c_str();
  std::
  regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
            (__s,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  *)local_38,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_specifier_abi_cxx11_,0);
  bVar1 = std::__cxx11::
          match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
          empty((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 *)local_38);
  if (bVar1) {
    throw_or_mimic<cxxopts::invalid_option_format_error>((string *)result._M_begin);
  }
  pvVar2 = std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       *)local_38,2);
  std::__cxx11::sub_match::operator_cast_to_string((string_type *)&long_sw,(sub_match *)pvVar2);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&long_sw;
  pvVar2 = std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       *)local_38,3);
  std::__cxx11::sub_match::operator_cast_to_string(&local_98,(sub_match *)pvVar2);
  local_78 = &local_98;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,local_50,local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&long_sw);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string, std::string> SplitSwitchDef(const std::string &text)
      {
        std::match_results<const char*> result;
        std::regex_match(text.c_str(), result, option_specifier);
        if (result.empty())
        {
          throw_or_mimic<invalid_option_format_error>(text);
        }

        const std::string& short_sw = result[2];
        const std::string& long_sw = result[3];

        return std::pair<std::string, std::string>(short_sw, long_sw);
      }